

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_case(lyout *out,int level,lys_node *node)

{
  long lVar1;
  lys_node_case *cas;
  lys_node *sub;
  lys_node *plStack_20;
  int content;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._4_4_ = 0;
  plStack_20 = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  if ((node->flags & 0x40) == 0) {
    yin_print_open(out,level,(char *)0x0,"case","name",node->name,0);
    node_local._4_4_ = node_local._4_4_ + 1;
    yin_print_snode_common
              (plStack_10,node_local._4_4_,plStack_20,plStack_20->module,(int *)((long)&sub + 4),1);
    lVar1._0_1_ = node->hash[0];
    lVar1._1_1_ = node->hash[1];
    lVar1._2_1_ = node->hash[2];
    lVar1._3_1_ = node->hash[3];
    lVar1._4_4_ = *(undefined4 *)&node->field_0x6c;
    if (lVar1 != 0) {
      yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
      yin_print_when(plStack_10,node_local._4_4_,plStack_20->module,*(lys_when **)node->hash);
    }
    yin_print_snode_common
              (plStack_10,node_local._4_4_,plStack_20,plStack_20->module,(int *)((long)&sub + 4),
               0x72);
  }
  else {
    sub._4_4_ = 1;
  }
  for (cas = (lys_node_case *)plStack_20->child; cas != (lys_node_case *)0x0;
      cas = (lys_node_case *)cas->next) {
    if (cas->parent == plStack_20) {
      yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)cas,0x903f);
    }
  }
  if ((plStack_20->flags & 0x40) == 0) {
    node_local._4_4_ = node_local._4_4_ + -1;
    yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,"case",sub._4_4_);
  }
  return;
}

Assistant:

static void
yin_print_case(struct lyout *out, int level, const struct lys_node *node)
{
    int content = 0;
    struct lys_node *sub;
    struct lys_node_case *cas = (struct lys_node_case *)node;

    if (!(node->flags & LYS_IMPLICIT)) {
        yin_print_open(out, level, NULL, "case", "name", cas->name, content);
        level++;

        yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_EXT);
        if (cas->when) {
            yin_print_close_parent(out, &content);
            yin_print_when(out, level, node->module, cas->when);
        }
        yin_print_snode_common(out, level, node, node->module, &content,
                               SNODE_COMMON_IFF | SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
    } else {
        content = 1;
    }

    /* print children */
    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub,
                        LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                        LYS_USES | LYS_ANYDATA);
    }

    if (node->flags & LYS_IMPLICIT) {
        /* do not print anything about the case, it was implicitely added by libyang */
        return;
    }

    level--;
    yin_print_close(out, level, NULL, "case", content);
}